

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool ClipperLib::Orientation(OutRec *outRec,bool UseFullInt64Range)

{
  long lVar1;
  OutPt *pOVar2;
  OutPt *pOVar3;
  ulong uVar4;
  OutPt *pOVar5;
  long lVar6;
  bool bVar7;
  Int128 local_68;
  Int128 local_58;
  long local_48;
  long local_40;
  Int128 local_38;
  Int128 local_28;
  
  pOVar5 = outRec->pts;
  if (pOVar5 == (OutPt *)0x0) {
    return false;
  }
  pOVar2 = pOVar5;
  for (pOVar3 = pOVar5->next; pOVar3 != pOVar5; pOVar3 = pOVar3->next) {
    lVar1 = (pOVar2->pt).Y;
    lVar6 = (pOVar3->pt).Y;
    if ((lVar1 <= lVar6) && ((lVar1 < lVar6 || ((pOVar3->pt).X < (pOVar2->pt).X)))) {
      pOVar2 = pOVar3;
    }
  }
  outRec->bottomPt = pOVar2;
  pOVar2->idx = outRec->idx;
  pOVar5 = pOVar2->next;
  pOVar3 = pOVar2;
  do {
    pOVar3 = pOVar3->prev;
    if ((pOVar2 == pOVar3) || ((pOVar2->pt).X != (pOVar3->pt).X)) break;
  } while ((pOVar2->pt).Y == (pOVar3->pt).Y);
  if (pOVar2 != pOVar5) {
    do {
      if (((pOVar2->pt).X != (pOVar5->pt).X) || ((pOVar2->pt).Y != (pOVar5->pt).Y)) break;
      pOVar5 = pOVar5->next;
    } while (pOVar2 != pOVar5);
  }
  local_38.lo = (pOVar2->pt).X;
  lVar1 = (pOVar2->pt).Y;
  lVar6 = (pOVar5->pt).X - local_38.lo;
  local_38.lo = local_38.lo - (pOVar3->pt).X;
  local_40 = (pOVar5->pt).Y - lVar1;
  if (UseFullInt64Range) {
    local_38.hi = local_38.lo >> 0x3f;
    local_48 = local_40 >> 0x3f;
    Int128::operator*(&local_28,&local_38);
    local_68.hi = lVar6 >> 0x3f;
    local_68.lo = lVar6;
    Int128::operator*(&local_58,&local_68);
    uVar4 = ~local_58.hi;
    if (local_58.lo == 0) {
      uVar4 = -local_58.hi;
    }
    uVar4 = uVar4 + local_28.hi + (ulong)((ulong)(local_28.lo - local_58.lo) < (ulong)-local_58.lo);
    if (uVar4 == 0) {
      uVar4 = local_28.lo - local_58.lo;
    }
    bVar7 = -1 < (long)uVar4;
  }
  else {
    bVar7 = lVar6 * (lVar1 - (pOVar3->pt).Y) <= local_40 * local_38.lo;
  }
  return bVar7;
}

Assistant:

bool Orientation(OutRec *outRec, bool UseFullInt64Range)
{
  if (!outRec->pts)
    return 0.0;

  //first make sure bottomPt is correctly assigned ...
  OutPt *opBottom = outRec->pts, *op = outRec->pts->next;
  while (op != outRec->pts)
  {
    if (op->pt.Y >= opBottom->pt.Y)
    {
      if (op->pt.Y > opBottom->pt.Y || op->pt.X < opBottom->pt.X)
      opBottom = op;
    }
    op = op->next;
  }
  outRec->bottomPt = opBottom;
  opBottom->idx = outRec->idx;

  op = opBottom;
  //find vertices either side of bottomPt (skipping duplicate points) ....
  OutPt *opPrev = op->prev;
  OutPt *opNext = op->next;
  while (op != opPrev && PointsEqual(op->pt, opPrev->pt))
    opPrev = opPrev->prev;
  while (op != opNext && PointsEqual(op->pt, opNext->pt))
    opNext = opNext->next;

  IntPoint ip1, ip2;
  ip1.X = op->pt.X - opPrev->pt.X;
  ip1.Y = op->pt.Y - opPrev->pt.Y;
  ip2.X = opNext->pt.X - op->pt.X;
  ip2.Y = opNext->pt.Y - op->pt.Y;

  if (UseFullInt64Range)
    return Int128(ip1.X) * Int128(ip2.Y) - Int128(ip2.X) * Int128(ip1.Y) >= 0;
  else
    return (ip1.X * ip2.Y - ip2.X * ip1.Y) >= 0;
}